

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeySymToKeyMapping.cpp
# Opt level: O0

Key sf::priv::keySymToKey(KeySym symbol)

{
  KeySym symbol_local;
  Key local_4;
  
  if (symbol == 0x20) {
    local_4 = Space;
  }
  else if (symbol == 0x27) {
    local_4 = Apostrophe;
  }
  else if (symbol == 0x2c) {
    local_4 = Comma;
  }
  else if (symbol == 0x2d) {
    local_4 = Dash;
  }
  else if (symbol == 0x2e) {
    local_4 = Period;
  }
  else if (symbol == 0x2f) {
    local_4 = Slash;
  }
  else if (symbol == 0x30) {
    local_4 = Num0;
  }
  else if (symbol == 0x31) {
    local_4 = Num1;
  }
  else if (symbol == 0x32) {
    local_4 = Num2;
  }
  else if (symbol == 0x33) {
    local_4 = Num3;
  }
  else if (symbol == 0x34) {
    local_4 = Num4;
  }
  else if (symbol == 0x35) {
    local_4 = Num5;
  }
  else if (symbol == 0x36) {
    local_4 = Num6;
  }
  else if (symbol == 0x37) {
    local_4 = Num7;
  }
  else if (symbol == 0x38) {
    local_4 = Num8;
  }
  else if (symbol == 0x39) {
    local_4 = Num9;
  }
  else if (symbol == 0x3b) {
    local_4 = SemiColon;
  }
  else if (symbol == 0x3d) {
    local_4 = Equal;
  }
  else if (symbol == 0x5b) {
    local_4 = LBracket;
  }
  else if (symbol == 0x5c) {
    local_4 = BackSlash;
  }
  else if (symbol == 0x5d) {
    local_4 = RBracket;
  }
  else if (symbol == 0x60) {
    local_4 = Grave;
  }
  else if (symbol == 0x61) {
    local_4 = A;
  }
  else if (symbol == 0x62) {
    local_4 = B;
  }
  else if (symbol == 99) {
    local_4 = C;
  }
  else if (symbol == 100) {
    local_4 = D;
  }
  else if (symbol == 0x65) {
    local_4 = E;
  }
  else if (symbol == 0x66) {
    local_4 = F;
  }
  else if (symbol == 0x67) {
    local_4 = G;
  }
  else if (symbol == 0x68) {
    local_4 = H;
  }
  else if (symbol == 0x69) {
    local_4 = I;
  }
  else if (symbol == 0x6a) {
    local_4 = J;
  }
  else if (symbol == 0x6b) {
    local_4 = K;
  }
  else if (symbol == 0x6c) {
    local_4 = L;
  }
  else if (symbol == 0x6d) {
    local_4 = M;
  }
  else if (symbol == 0x6e) {
    local_4 = N;
  }
  else if (symbol == 0x6f) {
    local_4 = O;
  }
  else if (symbol == 0x70) {
    local_4 = P;
  }
  else if (symbol == 0x71) {
    local_4 = Q;
  }
  else if (symbol == 0x72) {
    local_4 = R;
  }
  else if (symbol == 0x73) {
    local_4 = S;
  }
  else if (symbol == 0x74) {
    local_4 = T;
  }
  else if (symbol == 0x75) {
    local_4 = U;
  }
  else if (symbol == 0x76) {
    local_4 = V;
  }
  else if (symbol == 0x77) {
    local_4 = W;
  }
  else if (symbol == 0x78) {
    local_4 = X;
  }
  else if (symbol == 0x79) {
    local_4 = Y;
  }
  else if (symbol == 0x7a) {
    local_4 = Z;
  }
  else {
    if (symbol != 0xfe03) {
      if (symbol == 0xff08) {
        return BackSpace;
      }
      if (symbol == 0xff09) {
        return Tab;
      }
      if (symbol == 0xff0d) {
        return Enter;
      }
      if (symbol == 0xff13) {
        return Pause;
      }
      if (symbol == 0xff1b) {
        return Escape;
      }
      if (symbol == 0xff50) {
        return Home;
      }
      if (symbol == 0xff51) {
        return Left;
      }
      if (symbol == 0xff52) {
        return Up;
      }
      if (symbol == 0xff53) {
        return Right;
      }
      if (symbol == 0xff54) {
        return Down;
      }
      if (symbol == 0xff55) {
        return PageUp;
      }
      if (symbol == 0xff56) {
        return PageDown;
      }
      if (symbol == 0xff57) {
        return End;
      }
      if (symbol == 0xff63) {
        return Insert;
      }
      if (symbol == 0xff67) {
        return Menu;
      }
      if (symbol == 0xff8d) {
        return Enter;
      }
      if (symbol == 0xff95) {
        return Numpad7;
      }
      if (symbol == 0xff96) {
        return Numpad4;
      }
      if (symbol == 0xff97) {
        return Numpad8;
      }
      if (symbol == 0xff98) {
        return Numpad6;
      }
      if (symbol == 0xff99) {
        return Numpad2;
      }
      if (symbol == 0xff9a) {
        return Numpad9;
      }
      if (symbol == 0xff9b) {
        return Numpad3;
      }
      if (symbol == 0xff9c) {
        return Numpad1;
      }
      if (symbol == 0xff9d) {
        return Numpad5;
      }
      if (symbol == 0xff9e) {
        return Numpad0;
      }
      if (symbol == 0xff9f) {
        return Period;
      }
      if (symbol == 0xffaa) {
        return Multiply;
      }
      if (symbol == 0xffab) {
        return Add;
      }
      if (symbol == 0xffad) {
        return Subtract;
      }
      if (symbol == 0xffaf) {
        return Divide;
      }
      if (symbol == 0xffbe) {
        return F1;
      }
      if (symbol == 0xffbf) {
        return F2;
      }
      if (symbol == 0xffc0) {
        return F3;
      }
      if (symbol == 0xffc1) {
        return F4;
      }
      if (symbol == 0xffc2) {
        return F5;
      }
      if (symbol == 0xffc3) {
        return F6;
      }
      if (symbol == 0xffc4) {
        return F7;
      }
      if (symbol == 0xffc5) {
        return F8;
      }
      if (symbol == 0xffc6) {
        return F9;
      }
      if (symbol == 0xffc7) {
        return F10;
      }
      if (symbol == 0xffc8) {
        return F11;
      }
      if (symbol == 0xffc9) {
        return F12;
      }
      if (symbol == 0xffca) {
        return F13;
      }
      if (symbol == 0xffcb) {
        return F14;
      }
      if (symbol == 0xffcc) {
        return F15;
      }
      if (symbol == 0xffe1) {
        return LShift;
      }
      if (symbol == 0xffe2) {
        return RShift;
      }
      if (symbol == 0xffe3) {
        return LControl;
      }
      if (symbol == 0xffe4) {
        return RControl;
      }
      if (symbol == 0xffe9) {
        return LAlt;
      }
      if (symbol != 0xffea) {
        if (symbol == 0xffeb) {
          return LSystem;
        }
        if (symbol != 0xffec) {
          if (symbol != 0xffff) {
            return Unknown;
          }
          return Delete;
        }
        return RSystem;
      }
    }
    local_4 = RAlt;
  }
  return local_4;
}

Assistant:

Keyboard::Key keySymToKey(KeySym symbol)
{
    switch (symbol)
    {
        case XK_Shift_L:      return Keyboard::LShift;
        case XK_Shift_R:      return Keyboard::RShift;
        case XK_Control_L:    return Keyboard::LControl;
        case XK_Control_R:    return Keyboard::RControl;
        case XK_Alt_L:        return Keyboard::LAlt;
        case XK_ISO_Level3_Shift:
        case XK_Alt_R:        return Keyboard::RAlt;
        case XK_Super_L:      return Keyboard::LSystem;
        case XK_Super_R:      return Keyboard::RSystem;
        case XK_Menu:         return Keyboard::Menu;
        case XK_Escape:       return Keyboard::Escape;
        case XK_semicolon:    return Keyboard::SemiColon;
        case XK_slash:        return Keyboard::Slash;
        case XK_equal:        return Keyboard::Equal;
        case XK_minus:        return Keyboard::Dash;
        case XK_bracketleft:  return Keyboard::LBracket;
        case XK_bracketright: return Keyboard::RBracket;
        case XK_comma:        return Keyboard::Comma;
        case XK_period:       return Keyboard::Period;
        case XK_apostrophe:   return Keyboard::Quote;
        case XK_backslash:    return Keyboard::BackSlash;
        case XK_grave:        return Keyboard::Grave;
        case XK_space:        return Keyboard::Space;
        case XK_Return:       return Keyboard::Return;
        case XK_KP_Enter:     return Keyboard::Return;
        case XK_BackSpace:    return Keyboard::BackSpace;
        case XK_Tab:          return Keyboard::Tab;
        case XK_Prior:        return Keyboard::PageUp;
        case XK_Next:         return Keyboard::PageDown;
        case XK_End:          return Keyboard::End;
        case XK_Home:         return Keyboard::Home;
        case XK_Insert:       return Keyboard::Insert;
        case XK_Delete:       return Keyboard::Delete;
        case XK_KP_Add:       return Keyboard::Add;
        case XK_KP_Subtract:  return Keyboard::Subtract;
        case XK_KP_Multiply:  return Keyboard::Multiply;
        case XK_KP_Divide:    return Keyboard::Divide;
        case XK_KP_Delete:    return Keyboard::Period;
        case XK_Pause:        return Keyboard::Pause;
        case XK_F1:           return Keyboard::F1;
        case XK_F2:           return Keyboard::F2;
        case XK_F3:           return Keyboard::F3;
        case XK_F4:           return Keyboard::F4;
        case XK_F5:           return Keyboard::F5;
        case XK_F6:           return Keyboard::F6;
        case XK_F7:           return Keyboard::F7;
        case XK_F8:           return Keyboard::F8;
        case XK_F9:           return Keyboard::F9;
        case XK_F10:          return Keyboard::F10;
        case XK_F11:          return Keyboard::F11;
        case XK_F12:          return Keyboard::F12;
        case XK_F13:          return Keyboard::F13;
        case XK_F14:          return Keyboard::F14;
        case XK_F15:          return Keyboard::F15;
        case XK_Left:         return Keyboard::Left;
        case XK_Right:        return Keyboard::Right;
        case XK_Up:           return Keyboard::Up;
        case XK_Down:         return Keyboard::Down;
        case XK_KP_Insert:    return Keyboard::Numpad0;
        case XK_KP_End:       return Keyboard::Numpad1;
        case XK_KP_Down:      return Keyboard::Numpad2;
        case XK_KP_Page_Down: return Keyboard::Numpad3;
        case XK_KP_Left:      return Keyboard::Numpad4;
        case XK_KP_Begin:     return Keyboard::Numpad5;
        case XK_KP_Right:     return Keyboard::Numpad6;
        case XK_KP_Home:      return Keyboard::Numpad7;
        case XK_KP_Up:        return Keyboard::Numpad8;
        case XK_KP_Page_Up:   return Keyboard::Numpad9;
        case XK_a:            return Keyboard::A;
        case XK_b:            return Keyboard::B;
        case XK_c:            return Keyboard::C;
        case XK_d:            return Keyboard::D;
        case XK_e:            return Keyboard::E;
        case XK_f:            return Keyboard::F;
        case XK_g:            return Keyboard::G;
        case XK_h:            return Keyboard::H;
        case XK_i:            return Keyboard::I;
        case XK_j:            return Keyboard::J;
        case XK_k:            return Keyboard::K;
        case XK_l:            return Keyboard::L;
        case XK_m:            return Keyboard::M;
        case XK_n:            return Keyboard::N;
        case XK_o:            return Keyboard::O;
        case XK_p:            return Keyboard::P;
        case XK_q:            return Keyboard::Q;
        case XK_r:            return Keyboard::R;
        case XK_s:            return Keyboard::S;
        case XK_t:            return Keyboard::T;
        case XK_u:            return Keyboard::U;
        case XK_v:            return Keyboard::V;
        case XK_w:            return Keyboard::W;
        case XK_x:            return Keyboard::X;
        case XK_y:            return Keyboard::Y;
        case XK_z:            return Keyboard::Z;
        case XK_0:            return Keyboard::Num0;
        case XK_1:            return Keyboard::Num1;
        case XK_2:            return Keyboard::Num2;
        case XK_3:            return Keyboard::Num3;
        case XK_4:            return Keyboard::Num4;
        case XK_5:            return Keyboard::Num5;
        case XK_6:            return Keyboard::Num6;
        case XK_7:            return Keyboard::Num7;
        case XK_8:            return Keyboard::Num8;
        case XK_9:            return Keyboard::Num9;
        default:              return Keyboard::Unknown;
    }
}